

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5InitVtab(int bCreate,sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,
                char **pzErr)

{
  Fts5FullTable *local_60;
  Fts5FullTable *pTab;
  Fts5Config *pConfig;
  char **ppcStack_48;
  int rc;
  char **azConfig;
  Fts5Global *pGlobal;
  sqlite3_vtab **ppVTab_local;
  char **argv_local;
  void *pvStack_20;
  int argc_local;
  void *pAux_local;
  sqlite3 *db_local;
  int bCreate_local;
  
  pConfig._4_4_ = 0;
  pTab = (Fts5FullTable *)0x0;
  ppcStack_48 = argv;
  azConfig = (char **)pAux;
  pGlobal = (Fts5Global *)ppVTab;
  ppVTab_local = (sqlite3_vtab **)argv;
  argv_local._4_4_ = argc;
  pvStack_20 = pAux;
  pAux_local = db;
  db_local._4_4_ = bCreate;
  local_60 = (Fts5FullTable *)sqlite3Fts5MallocZero((int *)((long)&pConfig + 4),0x40);
  if (pConfig._4_4_ == 0) {
    pConfig._4_4_ =
         sqlite3Fts5ConfigParse
                   ((Fts5Global *)azConfig,(sqlite3 *)pAux_local,argv_local._4_4_,ppcStack_48,
                    (Fts5Config **)&pTab,pzErr);
  }
  if (pConfig._4_4_ == 0) {
    (local_60->p).pConfig = (Fts5Config *)pTab;
    local_60->pGlobal = (Fts5Global *)azConfig;
    pConfig._4_4_ =
         sqlite3Fts5IndexOpen((Fts5Config *)pTab,db_local._4_4_,&(local_60->p).pIndex,pzErr);
  }
  if (pConfig._4_4_ == 0) {
    pConfig._4_4_ =
         sqlite3Fts5StorageOpen
                   ((Fts5Config *)pTab,(local_60->p).pIndex,db_local._4_4_,&local_60->pStorage,pzErr
                   );
  }
  if (pConfig._4_4_ == 0) {
    pConfig._4_4_ = sqlite3Fts5ConfigDeclareVtab((Fts5Config *)pTab);
  }
  if (pConfig._4_4_ == 0) {
    pTab[2].p.pIndex = (Fts5Index *)pzErr;
    pConfig._4_4_ = sqlite3Fts5IndexLoadConfig((local_60->p).pIndex);
    sqlite3Fts5IndexRollback((local_60->p).pIndex);
    pTab[2].p.pIndex = (Fts5Index *)0x0;
  }
  if (pConfig._4_4_ != 0) {
    fts5FreeVtab(local_60);
    local_60 = (Fts5FullTable *)0x0;
  }
  *(Fts5FullTable **)&pGlobal->api = local_60;
  return pConfig._4_4_;
}

Assistant:

static int fts5InitVtab(
  int bCreate,                    /* True for xCreate, false for xConnect */
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Hash table containing tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  Fts5Global *pGlobal = (Fts5Global*)pAux;
  const char **azConfig = (const char**)argv;
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pConfig = 0;        /* Results of parsing argc/argv */
  Fts5FullTable *pTab = 0;        /* New virtual table object */

  /* Allocate the new vtab object and parse the configuration */
  pTab = (Fts5FullTable*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5FullTable));
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ConfigParse(pGlobal, db, argc, azConfig, &pConfig, pzErr);
    assert( (rc==SQLITE_OK && *pzErr==0) || pConfig==0 );
  }
  if( rc==SQLITE_OK ){
    pTab->p.pConfig = pConfig;
    pTab->pGlobal = pGlobal;
  }

  /* Open the index sub-system */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexOpen(pConfig, bCreate, &pTab->p.pIndex, pzErr);
  }

  /* Open the storage sub-system */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageOpen(
        pConfig, pTab->p.pIndex, bCreate, &pTab->pStorage, pzErr
    );
  }

  /* Call sqlite3_declare_vtab() */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5ConfigDeclareVtab(pConfig);
  }

  /* Load the initial configuration */
  if( rc==SQLITE_OK ){
    assert( pConfig->pzErrmsg==0 );
    pConfig->pzErrmsg = pzErr;
    rc = sqlite3Fts5IndexLoadConfig(pTab->p.pIndex);
    sqlite3Fts5IndexRollback(pTab->p.pIndex);
    pConfig->pzErrmsg = 0;
  }

  if( rc!=SQLITE_OK ){
    fts5FreeVtab(pTab);
    pTab = 0;
  }else if( bCreate ){
    fts5CheckTransactionState(pTab, FTS5_BEGIN, 0);
  }
  *ppVTab = (sqlite3_vtab*)pTab;
  return rc;
}